

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__bmp_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  uchar uVar1;
  stbi_uc sVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  uint uVar7;
  uint *in_RCX;
  uint *in_RDX;
  uint *in_RSI;
  uint *in_RDI;
  uint in_R8D;
  stbi_uc *p2;
  stbi_uc *p1;
  stbi_uc t;
  uint a_1;
  stbi__uint32 v_2;
  int bpp;
  uchar a;
  int easy;
  int z_1;
  int acount;
  int bcount;
  int gcount;
  int rcount;
  int ashift;
  int bshift;
  int gshift;
  int rshift;
  int v2;
  int v_1;
  int color;
  int v;
  int bit_offset;
  int z;
  int extra_data_limit;
  int header_limit;
  int bytes_read_so_far;
  stbi__bmp_data info;
  int target;
  int pad;
  int flip_vertically;
  int width;
  int j;
  int i;
  int psize;
  stbi_uc pal [256] [4];
  uint all_a;
  uint ma;
  uint mb;
  uint mg;
  uint mr;
  stbi_uc *out;
  uint in_stack_fffffffffffffae8;
  uint in_stack_fffffffffffffaec;
  uint in_stack_fffffffffffffaf0;
  uint in_stack_fffffffffffffaf4;
  stbi__context *in_stack_fffffffffffffaf8;
  uint in_stack_fffffffffffffb08;
  uint in_stack_fffffffffffffb0c;
  uint in_stack_fffffffffffffb10;
  int in_stack_fffffffffffffb14;
  undefined4 in_stack_fffffffffffffb18;
  int in_stack_fffffffffffffb1c;
  int local_4e0;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  int local_4d0;
  int local_4cc;
  int local_4c8;
  int local_4c4;
  int local_4c0;
  uint local_4bc;
  uint local_4b8;
  uint local_4b0;
  int local_4ac;
  int local_4a8;
  int local_498;
  int local_494;
  int local_490;
  uint local_48c;
  uint local_488;
  uint local_484;
  uint local_480;
  int local_478;
  uint local_474;
  int local_464;
  int local_460;
  int local_45c;
  stbi_uc asStack_458 [1028];
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uchar *local_40;
  uint local_2c;
  uint *local_28;
  uint *local_20;
  uint *local_18;
  uint *local_10;
  uchar *local_8;
  
  local_44 = 0;
  local_48 = 0;
  local_4c = 0;
  local_50 = 0;
  local_45c = 0;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  pvVar6 = stbi__bmp_parse_header
                     (in_stack_fffffffffffffaf8,
                      (stbi__bmp_data *)
                      CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
  if (pvVar6 == (void *)0x0) {
    local_8 = (uchar *)0x0;
  }
  else {
    uVar7 = local_10[1];
    uVar5 = local_10[1];
    if ((int)uVar5 < 1) {
      uVar5 = -uVar5;
    }
    local_10[1] = uVar5;
    if (local_10[1] < 0x1000001) {
      if (*local_10 < 0x1000001) {
        local_44 = local_48c;
        local_48 = local_488;
        local_4c = local_484;
        local_50 = local_480;
        local_54 = 0xff;
        if (local_490 == 0xc) {
          if (local_498 < 0x18) {
            local_45c = ((local_494 - local_478) + -0x18) / 3;
          }
        }
        else if (local_498 < 0x10) {
          local_45c = (local_494 - local_478) - local_490 >> 2;
        }
        if (local_45c == 0) {
          iVar4 = local_10[0x2e] +
                  ((int)*(undefined8 *)(local_10 + 0x30) - (int)*(undefined8 *)(local_10 + 0x34));
          if ((iVar4 < 1) || (0x400 < iVar4)) {
            stbi__err("Corrupt BMP");
            return (void *)0x0;
          }
          if ((local_494 < iVar4) || (0x400 < local_494 - iVar4)) {
            stbi__err("Corrupt BMP");
            return (void *)0x0;
          }
          stbi__skip((stbi__context *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                     in_stack_fffffffffffffaec);
        }
        if ((local_498 == 0x18) && (local_50 == 0xff000000)) {
          local_10[2] = 3;
        }
        else {
          uVar5 = 3;
          if (local_50 != 0) {
            uVar5 = 4;
          }
          local_10[2] = uVar5;
        }
        if ((local_2c == 0) || ((int)local_2c < 3)) {
          local_474 = local_10[2];
        }
        else {
          local_474 = local_2c;
        }
        iVar4 = stbi__mad3sizes_valid
                          (in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0,
                           in_stack_fffffffffffffaec,in_stack_fffffffffffffae8);
        if (iVar4 == 0) {
          stbi__err("Corrupt BMP");
          local_8 = (uchar *)0x0;
        }
        else {
          local_40 = (uchar *)stbi__malloc_mad3(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8,
                                                0,0x2d79e0);
          if (local_40 == (uchar *)0x0) {
            stbi__err("Out of memory");
            local_8 = (uchar *)0x0;
          }
          else {
            if (local_498 < 0x10) {
              local_4a8 = 0;
              if ((local_45c == 0) || (0x100 < local_45c)) {
                free(local_40);
                stbi__err("Corrupt BMP");
                return (void *)0x0;
              }
              for (local_460 = 0; local_460 < local_45c; local_460 = local_460 + 1) {
                sVar2 = stbi__get8((stbi__context *)
                                   CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
                asStack_458[(long)local_460 * 4 + 2] = sVar2;
                sVar2 = stbi__get8((stbi__context *)
                                   CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
                asStack_458[(long)local_460 * 4 + 1] = sVar2;
                sVar2 = stbi__get8((stbi__context *)
                                   CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
                asStack_458[(long)local_460 * 4] = sVar2;
                if (local_490 != 0xc) {
                  stbi__get8((stbi__context *)
                             CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
                }
                asStack_458[(long)local_460 * 4 + 3] = 0xff;
              }
              stbi__skip((stbi__context *)
                         CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                         in_stack_fffffffffffffaec);
              if (((local_498 != 1) && (local_498 != 4)) && (local_498 != 8)) {
                free(local_40);
                stbi__err("Corrupt BMP");
                return (void *)0x0;
              }
              if (local_498 == 1) {
                for (local_464 = 0; local_464 < (int)local_10[1]; local_464 = local_464 + 1) {
                  local_4ac = 7;
                  bVar3 = stbi__get8((stbi__context *)
                                     CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
                  local_4b0 = (uint)bVar3;
                  for (local_460 = 0; local_460 < (int)*local_10; local_460 = local_460 + 1) {
                    uVar5 = (int)local_4b0 >> ((byte)local_4ac & 0x1f) & 1;
                    local_40[local_4a8] = asStack_458[(long)(int)uVar5 * 4];
                    local_40[local_4a8 + 1] = asStack_458[(long)(int)uVar5 * 4 + 1];
                    local_40[local_4a8 + 2] = asStack_458[(long)(int)uVar5 * 4 + 2];
                    iVar4 = local_4a8 + 3;
                    if (local_474 == 4) {
                      local_40[local_4a8 + 3] = 0xff;
                      iVar4 = local_4a8 + 4;
                    }
                    local_4a8 = iVar4;
                    if (local_460 + 1U == *local_10) break;
                    local_4ac = local_4ac + -1;
                    if (local_4ac < 0) {
                      local_4ac = 7;
                      bVar3 = stbi__get8((stbi__context *)
                                         CONCAT44(in_stack_fffffffffffffaec,
                                                  in_stack_fffffffffffffae8));
                      local_4b0 = (uint)bVar3;
                    }
                  }
                  stbi__skip((stbi__context *)
                             CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                             in_stack_fffffffffffffaec);
                }
              }
              else {
                for (local_464 = 0; local_464 < (int)local_10[1]; local_464 = local_464 + 1) {
                  for (local_460 = 0; local_460 < (int)*local_10; local_460 = local_460 + 2) {
                    bVar3 = stbi__get8((stbi__context *)
                                       CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                                      );
                    local_4b8 = (uint)bVar3;
                    local_4bc = 0;
                    if (local_498 == 4) {
                      local_4bc = local_4b8 & 0xf;
                      local_4b8 = (int)local_4b8 >> 4;
                    }
                    local_40[local_4a8] = asStack_458[(long)(int)local_4b8 * 4];
                    local_40[local_4a8 + 1] = asStack_458[(long)(int)local_4b8 * 4 + 1];
                    local_40[local_4a8 + 2] = asStack_458[(long)(int)local_4b8 * 4 + 2];
                    iVar4 = local_4a8 + 3;
                    if (local_474 == 4) {
                      local_40[local_4a8 + 3] = 0xff;
                      iVar4 = local_4a8 + 4;
                    }
                    local_4a8 = iVar4;
                    if (local_460 + 1U == *local_10) break;
                    if (local_498 == 8) {
                      bVar3 = stbi__get8((stbi__context *)
                                         CONCAT44(in_stack_fffffffffffffaec,
                                                  in_stack_fffffffffffffae8));
                      local_4bc = (uint)bVar3;
                    }
                    local_40[local_4a8] = asStack_458[(long)(int)local_4bc * 4];
                    local_40[local_4a8 + 1] = asStack_458[(long)(int)local_4bc * 4 + 1];
                    local_40[local_4a8 + 2] = asStack_458[(long)(int)local_4bc * 4 + 2];
                    iVar4 = local_4a8 + 3;
                    if (local_474 == 4) {
                      local_40[local_4a8 + 3] = 0xff;
                      iVar4 = local_4a8 + 4;
                    }
                    local_4a8 = iVar4;
                    in_stack_fffffffffffffaf4 = local_4bc;
                  }
                  stbi__skip((stbi__context *)
                             CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                             in_stack_fffffffffffffaec);
                }
              }
            }
            else {
              local_4c0 = 0;
              local_4c4 = 0;
              local_4c8 = 0;
              local_4cc = 0;
              local_4d0 = 0;
              local_4d4 = 0;
              local_4d8 = 0;
              local_4dc = 0;
              local_4e0 = 0;
              in_stack_fffffffffffffb1c = 0;
              stbi__skip((stbi__context *)
                         CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                         in_stack_fffffffffffffaec);
              if (local_498 == 0x18) {
                in_stack_fffffffffffffb1c = 1;
              }
              else if ((((local_498 == 0x20) && (local_4c == 0xff)) && (local_48 == 0xff00)) &&
                      ((local_44 == 0xff0000 && (local_50 == 0xff000000)))) {
                in_stack_fffffffffffffb1c = 2;
              }
              if (in_stack_fffffffffffffb1c == 0) {
                if (((local_44 == 0) || (local_48 == 0)) || (local_4c == 0)) {
                  free(local_40);
                  stbi__err("Corrupt BMP");
                  return (void *)0x0;
                }
                local_4c0 = stbi__high_bit(local_44);
                local_4c0 = local_4c0 + -7;
                local_4d0 = stbi__bitcount(local_44);
                local_4c4 = stbi__high_bit(local_48);
                local_4c4 = local_4c4 + -7;
                local_4d4 = stbi__bitcount(local_48);
                local_4c8 = stbi__high_bit(local_4c);
                local_4c8 = local_4c8 + -7;
                local_4d8 = stbi__bitcount(local_4c);
                local_4cc = stbi__high_bit(local_50);
                local_4cc = local_4cc + -7;
                local_4dc = stbi__bitcount(local_50);
                if ((((8 < local_4d0) || (8 < local_4d4)) || (8 < local_4d8)) || (8 < local_4dc)) {
                  free(local_40);
                  stbi__err("Corrupt BMP");
                  return (void *)0x0;
                }
              }
              for (local_464 = 0; local_464 < (int)local_10[1]; local_464 = local_464 + 1) {
                if (in_stack_fffffffffffffb1c == 0) {
                  in_stack_fffffffffffffb14 = local_498;
                  for (local_460 = 0; local_460 < (int)*local_10; local_460 = local_460 + 1) {
                    if (in_stack_fffffffffffffb14 == 0x10) {
                      in_stack_fffffffffffffaec =
                           stbi__get16le((stbi__context *)
                                         CONCAT44(in_stack_fffffffffffffaf4,
                                                  in_stack_fffffffffffffaf0));
                    }
                    else {
                      in_stack_fffffffffffffaec =
                           stbi__get32le((stbi__context *)
                                         CONCAT44(in_stack_fffffffffffffaf4,
                                                  in_stack_fffffffffffffaf0));
                    }
                    in_stack_fffffffffffffb10 = in_stack_fffffffffffffaec;
                    iVar4 = stbi__shiftsigned(in_stack_fffffffffffffaec & local_44,local_4c0,
                                              local_4d0);
                    local_40[local_4e0] = (uchar)iVar4;
                    iVar4 = stbi__shiftsigned(in_stack_fffffffffffffb10 & local_48,local_4c4,
                                              local_4d4);
                    local_40[local_4e0 + 1] = (uchar)iVar4;
                    iVar4 = stbi__shiftsigned(in_stack_fffffffffffffb10 & local_4c,local_4c8,
                                              local_4d8);
                    local_40[local_4e0 + 2] = (uchar)iVar4;
                    if (local_50 == 0) {
                      in_stack_fffffffffffffae8 = 0xff;
                    }
                    else {
                      in_stack_fffffffffffffae8 =
                           stbi__shiftsigned(in_stack_fffffffffffffb10 & local_50,local_4cc,
                                             local_4dc);
                    }
                    local_54 = in_stack_fffffffffffffae8 | local_54;
                    iVar4 = local_4e0 + 3;
                    if (local_474 == 4) {
                      local_40[local_4e0 + 3] = (uchar)in_stack_fffffffffffffae8;
                      iVar4 = local_4e0 + 4;
                    }
                    local_4e0 = iVar4;
                    in_stack_fffffffffffffb0c = in_stack_fffffffffffffae8;
                  }
                }
                else {
                  for (local_460 = 0; local_460 < (int)*local_10; local_460 = local_460 + 1) {
                    sVar2 = stbi__get8((stbi__context *)
                                       CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                                      );
                    local_40[local_4e0 + 2] = sVar2;
                    sVar2 = stbi__get8((stbi__context *)
                                       CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                                      );
                    local_40[local_4e0 + 1] = sVar2;
                    sVar2 = stbi__get8((stbi__context *)
                                       CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                                      );
                    local_40[local_4e0] = sVar2;
                    if (in_stack_fffffffffffffb1c == 2) {
                      bVar3 = stbi__get8((stbi__context *)
                                         CONCAT44(in_stack_fffffffffffffaec,
                                                  in_stack_fffffffffffffae8));
                      in_stack_fffffffffffffaf0 = (uint)bVar3;
                    }
                    else {
                      in_stack_fffffffffffffaf0 = 0xff;
                    }
                    in_stack_fffffffffffffb18 =
                         CONCAT13((uchar)in_stack_fffffffffffffaf0,(int3)in_stack_fffffffffffffb18);
                    local_54 = in_stack_fffffffffffffaf0 | local_54;
                    iVar4 = local_4e0 + 3;
                    if (local_474 == 4) {
                      local_40[local_4e0 + 3] = (uchar)in_stack_fffffffffffffaf0;
                      iVar4 = local_4e0 + 4;
                    }
                    local_4e0 = iVar4;
                  }
                }
                stbi__skip((stbi__context *)
                           CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                           in_stack_fffffffffffffaec);
              }
            }
            if ((local_474 == 4) && (local_54 == 0)) {
              for (local_460 = *local_10 * 4 * local_10[1] + -1; -1 < local_460;
                  local_460 = local_460 + -4) {
                local_40[local_460] = 0xff;
              }
            }
            if (0 < (int)uVar7) {
              for (local_464 = 0; local_464 < (int)local_10[1] >> 1; local_464 = local_464 + 1) {
                uVar7 = local_464 * *local_10 * local_474;
                uVar5 = ((local_10[1] - 1) - local_464) * *local_10 * local_474;
                for (local_460 = 0; local_460 < (int)(*local_10 * local_474);
                    local_460 = local_460 + 1) {
                  uVar1 = local_40[(long)local_460 + (ulong)uVar7];
                  in_stack_fffffffffffffb08 = CONCAT13(uVar1,(int3)in_stack_fffffffffffffb08);
                  local_40[(long)local_460 + (ulong)uVar7] =
                       local_40[(long)local_460 + (ulong)uVar5];
                  local_40[(long)local_460 + (ulong)uVar5] = uVar1;
                }
              }
            }
            if (((local_2c == 0) || (local_2c == local_474)) ||
               (local_40 = stbi__convert_format
                                     ((uchar *)CONCAT44(in_stack_fffffffffffffb1c,
                                                        in_stack_fffffffffffffb18),
                                      in_stack_fffffffffffffb14,in_stack_fffffffffffffb10,
                                      in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
               local_8 = local_40, local_40 != (uchar *)0x0)) {
              *local_18 = *local_10;
              *local_20 = local_10[1];
              if (local_28 != (uint *)0x0) {
                *local_28 = local_10[2];
              }
              local_8 = local_40;
            }
          }
        }
      }
      else {
        stbi__err("Very large image (corrupt?)");
        local_8 = (uchar *)0x0;
      }
    }
    else {
      stbi__err("Very large image (corrupt?)");
      local_8 = (uchar *)0x0;
    }
  }
  return local_8;
}

Assistant:

static void *stbi__bmp_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   stbi_uc *out;
   unsigned int mr=0,mg=0,mb=0,ma=0, all_a;
   stbi_uc pal[256][4];
   int psize=0,i,j,width;
   int flip_vertically, pad, target;
   stbi__bmp_data info;
   STBI_NOTUSED(ri);

   info.all_a = 255;
   if (stbi__bmp_parse_header(s, &info) == NULL)
      return NULL; // error code already set

   flip_vertically = ((int) s->img_y) > 0;
   s->img_y = abs((int) s->img_y);

   if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   mr = info.mr;
   mg = info.mg;
   mb = info.mb;
   ma = info.ma;
   all_a = info.all_a;

   if (info.hsz == 12) {
      if (info.bpp < 24)
         psize = (info.offset - info.extra_read - 24) / 3;
   } else {
      if (info.bpp < 16)
         psize = (info.offset - info.extra_read - info.hsz) >> 2;
   }
   if (psize == 0) {
      // accept some number of extra bytes after the header, but if the offset points either to before
      // the header ends or implies a large amount of extra data, reject the file as malformed
      int bytes_read_so_far = s->callback_already_read + (int)(s->img_buffer - s->img_buffer_original);
      int header_limit = 1024; // max we actually read is below 256 bytes currently.
      int extra_data_limit = 256*4; // what ordinarily goes here is a palette; 256 entries*4 bytes is its max size.
      if (bytes_read_so_far <= 0 || bytes_read_so_far > header_limit) {
         return stbi__errpuc("bad header", "Corrupt BMP");
      }
      // we established that bytes_read_so_far is positive and sensible.
      // the first half of this test rejects offsets that are either too small positives, or
      // negative, and guarantees that info.offset >= bytes_read_so_far > 0. this in turn
      // ensures the number computed in the second half of the test can't overflow.
      if (info.offset < bytes_read_so_far || info.offset - bytes_read_so_far > extra_data_limit) {
         return stbi__errpuc("bad offset", "Corrupt BMP");
      } else {
         stbi__skip(s, info.offset - bytes_read_so_far);
      }
   }

   if (info.bpp == 24 && ma == 0xff000000)
      s->img_n = 3;
   else
      s->img_n = ma ? 4 : 3;
   if (req_comp && req_comp >= 3) // we can directly decode 3 or 4
      target = req_comp;
   else
      target = s->img_n; // if they want monochrome, we'll post-convert

   // sanity-check size
   if (!stbi__mad3sizes_valid(target, s->img_x, s->img_y, 0))
      return stbi__errpuc("too large", "Corrupt BMP");

   out = (stbi_uc *) stbi__malloc_mad3(target, s->img_x, s->img_y, 0);
   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   if (info.bpp < 16) {
      int z=0;
      if (psize == 0 || psize > 256) { STBI_FREE(out); return stbi__errpuc("invalid", "Corrupt BMP"); }
      for (i=0; i < psize; ++i) {
         pal[i][2] = stbi__get8(s);
         pal[i][1] = stbi__get8(s);
         pal[i][0] = stbi__get8(s);
         if (info.hsz != 12) stbi__get8(s);
         pal[i][3] = 255;
      }
      stbi__skip(s, info.offset - info.extra_read - info.hsz - psize * (info.hsz == 12 ? 3 : 4));
      if (info.bpp == 1) width = (s->img_x + 7) >> 3;
      else if (info.bpp == 4) width = (s->img_x + 1) >> 1;
      else if (info.bpp == 8) width = s->img_x;
      else { STBI_FREE(out); return stbi__errpuc("bad bpp", "Corrupt BMP"); }
      pad = (-width)&3;
      if (info.bpp == 1) {
         for (j=0; j < (int) s->img_y; ++j) {
            int bit_offset = 7, v = stbi__get8(s);
            for (i=0; i < (int) s->img_x; ++i) {
               int color = (v>>bit_offset)&0x1;
               out[z++] = pal[color][0];
               out[z++] = pal[color][1];
               out[z++] = pal[color][2];
               if (target == 4) out[z++] = 255;
               if (i+1 == (int) s->img_x) break;
               if((--bit_offset) < 0) {
                  bit_offset = 7;
                  v = stbi__get8(s);
               }
            }
            stbi__skip(s, pad);
         }
      } else {
         for (j=0; j < (int) s->img_y; ++j) {
            for (i=0; i < (int) s->img_x; i += 2) {
               int v=stbi__get8(s),v2=0;
               if (info.bpp == 4) {
                  v2 = v & 15;
                  v >>= 4;
               }
               out[z++] = pal[v][0];
               out[z++] = pal[v][1];
               out[z++] = pal[v][2];
               if (target == 4) out[z++] = 255;
               if (i+1 == (int) s->img_x) break;
               v = (info.bpp == 8) ? stbi__get8(s) : v2;
               out[z++] = pal[v][0];
               out[z++] = pal[v][1];
               out[z++] = pal[v][2];
               if (target == 4) out[z++] = 255;
            }
            stbi__skip(s, pad);
         }
      }
   } else {
      int rshift=0,gshift=0,bshift=0,ashift=0,rcount=0,gcount=0,bcount=0,acount=0;
      int z = 0;
      int easy=0;
      stbi__skip(s, info.offset - info.extra_read - info.hsz);
      if (info.bpp == 24) width = 3 * s->img_x;
      else if (info.bpp == 16) width = 2*s->img_x;
      else /* bpp = 32 and pad = 0 */ width=0;
      pad = (-width) & 3;
      if (info.bpp == 24) {
         easy = 1;
      } else if (info.bpp == 32) {
         if (mb == 0xff && mg == 0xff00 && mr == 0x00ff0000 && ma == 0xff000000)
            easy = 2;
      }
      if (!easy) {
         if (!mr || !mg || !mb) { STBI_FREE(out); return stbi__errpuc("bad masks", "Corrupt BMP"); }
         // right shift amt to put high bit in position #7
         rshift = stbi__high_bit(mr)-7; rcount = stbi__bitcount(mr);
         gshift = stbi__high_bit(mg)-7; gcount = stbi__bitcount(mg);
         bshift = stbi__high_bit(mb)-7; bcount = stbi__bitcount(mb);
         ashift = stbi__high_bit(ma)-7; acount = stbi__bitcount(ma);
         if (rcount > 8 || gcount > 8 || bcount > 8 || acount > 8) { STBI_FREE(out); return stbi__errpuc("bad masks", "Corrupt BMP"); }
      }
      for (j=0; j < (int) s->img_y; ++j) {
         if (easy) {
            for (i=0; i < (int) s->img_x; ++i) {
               unsigned char a;
               out[z+2] = stbi__get8(s);
               out[z+1] = stbi__get8(s);
               out[z+0] = stbi__get8(s);
               z += 3;
               a = (easy == 2 ? stbi__get8(s) : 255);
               all_a |= a;
               if (target == 4) out[z++] = a;
            }
         } else {
            int bpp = info.bpp;
            for (i=0; i < (int) s->img_x; ++i) {
               stbi__uint32 v = (bpp == 16 ? (stbi__uint32) stbi__get16le(s) : stbi__get32le(s));
               unsigned int a;
               out[z++] = STBI__BYTECAST(stbi__shiftsigned(v & mr, rshift, rcount));
               out[z++] = STBI__BYTECAST(stbi__shiftsigned(v & mg, gshift, gcount));
               out[z++] = STBI__BYTECAST(stbi__shiftsigned(v & mb, bshift, bcount));
               a = (ma ? stbi__shiftsigned(v & ma, ashift, acount) : 255);
               all_a |= a;
               if (target == 4) out[z++] = STBI__BYTECAST(a);
            }
         }
         stbi__skip(s, pad);
      }
   }

   // if alpha channel is all 0s, replace with all 255s
   if (target == 4 && all_a == 0)
      for (i=4*s->img_x*s->img_y-1; i >= 0; i -= 4)
         out[i] = 255;

   if (flip_vertically) {
      stbi_uc t;
      for (j=0; j < (int) s->img_y>>1; ++j) {
         stbi_uc *p1 = out +      j     *s->img_x*target;
         stbi_uc *p2 = out + (s->img_y-1-j)*s->img_x*target;
         for (i=0; i < (int) s->img_x*target; ++i) {
            t = p1[i]; p1[i] = p2[i]; p2[i] = t;
         }
      }
   }

   if (req_comp && req_comp != target) {
      out = stbi__convert_format(out, target, req_comp, s->img_x, s->img_y);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }

   *x = s->img_x;
   *y = s->img_y;
   if (comp) *comp = s->img_n;
   return out;
}